

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O0

size_t __thiscall TBSCertList::SetDataSize(TBSCertList *this)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  TBSCertList *this_local;
  
  sVar1 = DerBase::EncodedSize(&(this->version).super_DerBase);
  sVar2 = DerBase::EncodedSize(&(this->signature).super_DerBase);
  sVar3 = Name::EncodedSize(&this->issuer);
  sVar4 = DerBase::EncodedSize(&(this->thisUpdate).super_DerBase);
  sVar5 = DerBase::EncodedSize(&(this->nextUpdate).super_DerBase);
  sVar6 = DerBase::EncodedSize(&(this->revokedCertificates).super_DerBase);
  sVar7 = ContextSpecificHolder<Extensions,_(unsigned_char)'\xa0',_(OptionType)1>::EncodedSize
                    (&this->crlExtensions);
  (this->super_DerBase).cbData = sVar1 + sVar2 + sVar3 + sVar4 + sVar5 + sVar6 + sVar7;
  return (this->super_DerBase).cbData;
}

Assistant:

virtual size_t SetDataSize() override
	{
		cbData =
			version.EncodedSize() +
			signature.EncodedSize() +
			issuer.EncodedSize() +
			thisUpdate.EncodedSize() +
			nextUpdate.EncodedSize() +
			revokedCertificates.EncodedSize() +
			crlExtensions.EncodedSize();

		return cbData;
	}